

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fFloatStateQueryTests.cpp
# Opt level: O1

void __thiscall
deqp::gles2::Functional::FloatStateQueryVerifiers::GetIntegerVerifier::verifyFloatRange
          (GetIntegerVerifier *this,TestContext *testCtx,GLenum name,GLfloat min,GLfloat max)

{
  ostringstream *this_00;
  bool bVar1;
  float fVar2;
  float fVar3;
  StateQueryMemoryWriteGuard<int[2]> range;
  StateQueryMemoryWriteGuard<int[2]> local_1b8;
  undefined1 local_1a0 [384];
  
  fVar2 = floorf(min + 0.5);
  fVar3 = ceilf(max + -0.5);
  local_1b8.m_postguard[0] = -0x21212122;
  local_1b8.m_postguard[1] = -0x21212122;
  local_1b8.m_preguard[0] = -0x21212122;
  local_1b8.m_preguard[1] = -0x21212122;
  local_1b8.m_value[0] = -0x21212122;
  local_1b8.m_value[1] = -0x21212122;
  glu::CallLogWrapper::glGetIntegerv
            (&(this->super_StateVerifier).super_CallLogWrapper,name,local_1b8.m_value);
  bVar1 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<int[2]>::verifyValidity
                    (&local_1b8,testCtx);
  if (bVar1) {
    if (((int)fVar2 < local_1b8.m_value[0]) || (local_1b8.m_value[1] < (int)fVar3)) {
      local_1a0._0_8_ = testCtx->m_log;
      this_00 = (ostringstream *)(local_1a0 + 8);
      std::__cxx11::ostringstream::ostringstream(this_00);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)this_00,"// ERROR: range [",0x11);
      std::ostream::operator<<(this_00,(int)fVar2);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,", ",2);
      std::ostream::operator<<(this_00,(int)fVar3);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"]",1);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)this_00," is not in range [",0x12);
      std::ostream::operator<<(this_00,local_1b8.m_value[0]);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,", ",2);
      std::ostream::operator<<(this_00,local_1b8.m_value[1]);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"]",1);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1a0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(this_00);
      std::ios_base::~ios_base((ios_base *)(local_1a0 + 0x78));
      if (testCtx->m_testResult == QP_TEST_RESULT_PASS) {
        tcu::TestContext::setTestResult(testCtx,QP_TEST_RESULT_FAIL,"Got invalid integer range");
      }
    }
  }
  return;
}

Assistant:

void GetIntegerVerifier::verifyFloatRange (tcu::TestContext& testCtx, GLenum name, GLfloat min, GLfloat max)
{
	using tcu::TestLog;

	const GLint testRangeAsGLint[] =
	{
		StateQueryUtil::roundGLfloatToNearestIntegerHalfUp<GLint>(min),
		StateQueryUtil::roundGLfloatToNearestIntegerHalfDown<GLint>(max)
	};

	StateQueryMemoryWriteGuard<GLint[2]> range;
	glGetIntegerv(name, range);

	if (!range.verifyValidity(testCtx))
		return;

	// check if test range outside of gl state range
	if (testRangeAsGLint[0] < range[0] ||
		testRangeAsGLint[1] > range[1])
	{
		testCtx.getLog() << TestLog::Message
			<< "// ERROR: range ["
			<< testRangeAsGLint[0] << ", "
			<< testRangeAsGLint[1] << "]"
			<< " is not in range ["
			<< range[0] << ", "
			<< range[1] << "]" << TestLog::EndMessage;

		if (testCtx.getTestResult() == QP_TEST_RESULT_PASS)
			testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Got invalid integer range");
	}
}